

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  uint uVar2;
  pointer pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TextureCube *this_00;
  ulong uVar6;
  long extraout_RAX;
  long lVar7;
  NotSupportedError *this_01;
  long lVar8;
  ulong uVar9;
  deUint32 step;
  string local_50;
  
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])(),
     0 < *(int *)(CONCAT44(extraout_var,iVar4) + 0x20))) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Projected lookup validation not supported in multisample config"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_01,&local_50);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_00,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_00;
  uVar2 = this->m_size;
  if (uVar2 == 0) {
    uVar5 = 0x20;
  }
  else {
    uVar5 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  uVar9 = 0;
  uVar6 = 0;
  if (0 < (int)(0x1f - uVar5)) {
    uVar6 = (ulong)(0x1f - uVar5);
  }
  lVar1 = uVar6 * 0x28 + 0x28;
  lVar7 = lVar1;
  do {
    if (uVar2 != 0) {
      lVar8 = 0;
      iVar4 = 0;
      do {
        if ((CubeFace)uVar9 < CUBEFACE_LAST) {
          iVar4 = (*(code *)(&DAT_01c33350 + *(int *)(&DAT_01c33350 + (uVar9 & 0xffffffff) * 4)))();
          return iVar4;
        }
        tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar9,iVar4);
        pPVar3 = (this->m_texture->m_refTexture).m_access[uVar9].
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec((RGBA *)&local_50);
        tcu::clear((PixelBufferAccess *)
                   ((long)(pPVar3->super_ConstPixelBufferAccess).m_size.m_data + lVar8 + -8),
                   (Vec4 *)&local_50);
        iVar4 = iVar4 + 1;
        lVar8 = lVar8 + 0x28;
        lVar7 = extraout_RAX;
      } while (lVar1 != lVar8);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 6);
  return (int)lVar7;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}